

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O2

void __thiscall
bloaty::RangeMap::AddDualRange
          (RangeMap *this,uint64_t addr,uint64_t size,uint64_t otheraddr,string *label)

{
  ulong uVar1;
  bool bVar2;
  iterator iter;
  iterator iVar3;
  uint64_t addr_00;
  ulong uVar4;
  uint64_t uVar5;
  ulong uVar6;
  Entry local_98;
  pair<unsigned_long,_bloaty::RangeMap::Entry> local_68;
  
  if (2 < verbose_level) {
    printf("%p AddDualRange([%lx, %lx], %lx, %s)\n",this,addr,size,otheraddr,
           (label->_M_dataplus)._M_p);
  }
  if (size != 0) {
    iter = FindContainingOrAfter(this,addr);
    if (size == 0xffffffffffffffff) {
      if (otheraddr != 0xffffffffffffffff) {
        __assert_fail("otheraddr == kNoTranslation",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                      ,0xc1,
                      "void bloaty::RangeMap::AddDualRange(uint64_t, uint64_t, uint64_t, const std::string &)"
                     );
      }
      if ((_Rb_tree_header *)iter._M_node != &(this->mappings_)._M_t._M_impl.super__Rb_tree_header)
      {
        bVar2 = EntryContainsStrict<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                          (this,(_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                                 )iter._M_node,addr);
        if (bVar2) {
          MaybeSetLabel<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                    (this,(_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                           )iter._M_node,label,addr,0xffffffffffffffff);
          return;
        }
      }
      std::__cxx11::string::string((string *)&local_98,(string *)label);
      local_98.size = 0xffffffffffffffff;
      local_98.other_start = 0xffffffffffffffff;
      local_68.first = addr;
      Entry::Entry(&local_68.second,&local_98);
      iVar3 = std::
              _Rb_tree<unsigned_long,std::pair<unsigned_long_const,bloaty::RangeMap::Entry>,std::_Select1st<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
              ::_M_emplace_hint_unique<std::pair<unsigned_long,bloaty::RangeMap::Entry>>
                        ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,bloaty::RangeMap::Entry>,std::_Select1st<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                          *)this,iter._M_node,&local_68);
      std::__cxx11::string::~string((string *)&local_68.second);
      std::__cxx11::string::~string((string *)&local_98);
      if (2 < verbose_level) {
        EntryDebugString<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                  ((string *)&local_68,this,
                   (_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>)
                   iVar3._M_node);
        printf("  added entry: %s\n",local_68.first);
        std::__cxx11::string::~string((string *)&local_68);
      }
    }
    else {
      uVar6 = size + addr;
      if (CARRY8(size,addr)) {
        __assert_fail("end >= addr",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                      ,0xd0,
                      "void bloaty::RangeMap::AddDualRange(uint64_t, uint64_t, uint64_t, const std::string &)"
                     );
      }
      addr_00 = addr;
      while (addr_00 <= uVar6 && uVar6 - addr_00 != 0) {
        uVar4 = uVar6;
        if (&(this->mappings_)._M_t._M_impl.super__Rb_tree_header == (_Rb_tree_header *)iter._M_node
           ) {
LAB_00177d0d:
          if (uVar4 < addr_00) {
            __assert_fail("this_end >= addr",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                          ,0xea,
                          "void bloaty::RangeMap::AddDualRange(uint64_t, uint64_t, uint64_t, const std::string &)"
                         );
          }
          uVar5 = addr_00 + (otheraddr - addr);
          if (otheraddr == 0xffffffffffffffff) {
            uVar5 = 0xffffffffffffffff;
          }
          std::__cxx11::string::string((string *)&local_98,(string *)label);
          local_98.size = uVar4 - addr_00;
          local_98.other_start = uVar5;
          local_68.first = addr_00;
          Entry::Entry(&local_68.second,&local_98);
          iVar3 = std::
                  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,bloaty::RangeMap::Entry>,std::_Select1st<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                  ::_M_emplace_hint_unique<std::pair<unsigned_long,bloaty::RangeMap::Entry>>
                            ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,bloaty::RangeMap::Entry>,std::_Select1st<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                              *)this,iter._M_node,&local_68);
          std::__cxx11::string::~string((string *)&local_68.second);
          std::__cxx11::string::~string((string *)&local_98);
          if (2 < verbose_level) {
            EntryDebugString<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                      ((string *)&local_68,this,
                       (_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>)
                       iVar3._M_node);
            printf("  added entry: %s\n",local_68.first);
            std::__cxx11::string::~string((string *)&local_68);
          }
          CheckConsistency<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                    (this,(_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                           )iVar3._M_node);
          addr_00 = uVar4;
        }
        else {
          bVar2 = EntryContains<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                            (this,(_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                                   )iter._M_node,addr_00);
          if (!bVar2) {
            uVar1 = *(ulong *)(iter._M_node + 1);
            if ((uVar1 < uVar6) && (uVar4 = uVar1, uVar1 < addr_00)) {
              __assert_fail("it->first >= addr",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/range_map.cc"
                            ,0xe4,
                            "void bloaty::RangeMap::AddDualRange(uint64_t, uint64_t, uint64_t, const std::string &)"
                           );
            }
            goto LAB_00177d0d;
          }
          MaybeSetLabel<std::_Rb_tree_iterator<std::pair<unsigned_long_const,bloaty::RangeMap::Entry>>>
                    (this,(_Rb_tree_iterator<std::pair<const_unsigned_long,_bloaty::RangeMap::Entry>_>
                           )iter._M_node,label,addr_00,uVar6 - addr_00);
          addr_00 = RangeEndUnknownLimit(this,(const_iterator)iter._M_node,addr_00);
          iter._M_node = (_Base_ptr)std::_Rb_tree_increment(iter._M_node);
        }
      }
    }
  }
  return;
}

Assistant:

void RangeMap::AddDualRange(uint64_t addr, uint64_t size, uint64_t otheraddr,
                            const std::string& label) {
  if (verbose_level > 2) {
    printf("%p AddDualRange([%" PRIx64 ", %" PRIx64 "], %" PRIx64 ", %s)\n",
           this, addr, size, otheraddr, label.c_str());
  }

  if (size == 0) return;

  auto it = FindContainingOrAfter(addr);

  if (size == kUnknownSize) {
    assert(otheraddr == kNoTranslation);
    if (it != mappings_.end() && EntryContainsStrict(it, addr)) {
      MaybeSetLabel(it, label, addr, kUnknownSize);
    } else {
      auto iter = mappings_.emplace_hint(
          it, std::make_pair(addr, Entry(label, kUnknownSize, kNoTranslation)));
      if (verbose_level > 2) {
        printf("  added entry: %s\n", EntryDebugString(iter).c_str());
      }
    }
    return;
  }

  const uint64_t base = addr;
  uint64_t end = addr + size;
  assert(end >= addr);

  while (1) {
    // Advance past existing entries that intersect this range until we find a
    // gap.
    while (addr < end && !IterIsEnd(it) && EntryContains(it, addr)) {
      assert(end >= addr);
      MaybeSetLabel(it, label, addr, end - addr);
      addr = RangeEndUnknownLimit(it, addr);
      ++it;
    }

    if (addr >= end) {
      return;
    }

    // We found a gap and need to create an entry.  Need to make sure the new
    // entry doesn't extend into a range that was previously defined.
    uint64_t this_end = end;
    if (it != mappings_.end() && end > it->first) {
      assert(it->first >= addr);
      this_end = std::min(end, it->first);
    }

    uint64_t other = (otheraddr == kNoTranslation) ? kNoTranslation
                                                   : addr - base + otheraddr;
    assert(this_end >= addr);
    auto iter = mappings_.emplace_hint(
        it, std::make_pair(addr, Entry(label, this_end - addr, other)));
    if (verbose_level > 2) {
      printf("  added entry: %s\n", EntryDebugString(iter).c_str());
    }
    CheckConsistency(iter);
    addr = this_end;
  }
}